

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O3

bool __thiscall
Clasp::SatPreprocessor::preprocess(SatPreprocessor *this,SharedContext *ctx,Options *opts)

{
  ClauseList *pCVar1;
  byte bVar2;
  uint uVar3;
  Literal x;
  Solver *this_00;
  pointer pLVar4;
  pointer pPVar5;
  pointer pVVar6;
  pointer pVVar7;
  pointer puVar8;
  Options OVar9;
  pointer ppCVar10;
  Clause *pCVar11;
  bool bVar12;
  Share SVar13;
  int iVar14;
  size_type sVar15;
  SatPreprocessor *pSVar16;
  ulong uVar17;
  ulong *puVar18;
  ulong uVar19;
  long lVar20;
  uint32 uVar21;
  long *plVar22;
  uint uVar23;
  void *mem;
  Result RVar24;
  Freeze act;
  OnExit onExit;
  uint local_64;
  ClauseRep local_58;
  OnExit local_48;
  
  this->ctx_ = ctx;
  this->opts_ = opts;
  this_00 = *(ctx->solvers_).ebo_.buf;
  local_48.rest = (SatPreprocessor *)0x0;
  pSVar16 = (SatPreprocessor *)((ctx->satPrepro).ptr_ & 0xfffffffffffffffe);
  if (pSVar16 == this) {
    (ctx->satPrepro).ptr_ = (uintp)pSVar16;
    local_48.rest = pSVar16;
  }
  uVar17 = (ulong)(this->units_).ebo_.size;
  local_48.ctx = ctx;
  local_48.self = this;
  if (uVar17 != 0) {
    pLVar4 = (this->units_).ebo_.buf;
    lVar20 = 0;
    do {
      bVar12 = SharedContext::addUnary(ctx,(Literal)*(uint32 *)((long)&pLVar4->rep_ + lVar20));
      if (!bVar12) goto LAB_0015fbf9;
      lVar20 = lVar20 + 4;
    } while (uVar17 << 2 != lVar20);
  }
  (this->units_).ebo_.size = 0;
  bVar12 = Solver::propagate(this_00);
  if (bVar12) {
    SVar13 = ctx->share_;
    if (((uint)SVar13 >> 0x1b & 1) != 0) {
      *opts = (Options)((ulong)*opts & 0xfffffffffffffffc | (ulong)(((ulong)*opts & 3) != 0));
      SVar13 = ctx->share_;
    }
    if (((uint)SVar13 >> 0x1c & 1) != 0) {
      uVar17 = (ulong)(ctx->output).preds_.ebo_.size;
      if (uVar17 != 0) {
        pPVar5 = (ctx->output).preds_.ebo_.buf;
        pVVar6 = (ctx->varInfo_).ebo_.buf;
        uVar21 = (ctx->stats_).vars.frozen;
        lVar20 = 0;
        do {
          uVar23 = *(uint *)((long)&(pPVar5->cond).rep_ + lVar20);
          if (3 < uVar23) {
            uVar23 = uVar23 >> 2;
            bVar2 = pVVar6[uVar23].rep;
            if ((bVar2 & 0x40) == 0) {
              pVVar6[uVar23].rep = bVar2 | 0x40;
              uVar21 = uVar21 + 1;
              (ctx->stats_).vars.frozen = uVar21;
            }
          }
          lVar20 = lVar20 + 0x10;
        } while (uVar17 << 4 != lVar20);
      }
      uVar23 = (ctx->output).vars_.lo;
      uVar3 = (ctx->output).vars_.hi;
      if (uVar23 != uVar3) {
        pVVar6 = (ctx->varInfo_).ebo_.buf;
        uVar21 = (ctx->stats_).vars.frozen;
        do {
          if (uVar23 != 0) {
            bVar2 = pVVar6[uVar23].rep;
            if ((bVar2 & 0x40) == 0) {
              pVVar6[uVar23].rep = bVar2 | 0x40;
              uVar21 = uVar21 + 1;
              (ctx->stats_).vars.frozen = uVar21;
            }
          }
          uVar23 = uVar23 + 1;
        } while (uVar3 != uVar23);
      }
    }
    if (((ctx->share_).field_0x3 & 0x20) != 0) {
      uVar17 = (ulong)(ctx->heuristic).entries_.ebo_.size;
      if (uVar17 != 0) {
        pVVar7 = (ctx->heuristic).entries_.ebo_.buf;
        puVar8 = ((*(ctx->solvers_).ebo_.buf)->assign_).assign_.ebo_.buf;
        pVVar6 = (ctx->varInfo_).ebo_.buf;
        uVar21 = (ctx->stats_).vars.frozen;
        lVar20 = 0;
        do {
          uVar19 = *(ulong *)(&pVVar7->field_0x0 + lVar20);
          if (((uVar19 & 0x3fffffff00000000) != 0) &&
             ((byte)(*(byte *)((long)puVar8 + (ulong)((int)uVar19 * 2 & 0xfffffffc)) & 3) !=
              (byte)(2 - ((byte)uVar19 & 1)))) {
            uVar23 = (uint)(uVar19 >> 0x20) & 0x3fffffff;
            bVar2 = pVVar6[uVar23].rep;
            if ((bVar2 & 0x40) == 0) {
              pVVar6[uVar23].rep = bVar2 | 0x40;
              uVar21 = uVar21 + 1;
              (ctx->stats_).vars.frozen = uVar21;
            }
          }
          lVar20 = lVar20 + 0xc;
        } while (uVar17 * 0xc != lVar20);
      }
      local_58._0_8_ = &PTR__DefaultAction_001e87a8;
      plVar22 = (long *)((ctx->config_).ptr_ & 0xfffffffffffffffe);
      local_58.lits = (Literal *)ctx;
      puVar18 = (ulong *)(**(code **)(*plVar22 + 0x30))(plVar22,0);
      uVar23 = 0x80000000;
      if (((*puVar18 & 0x700000000) == 0x400000000) && (0x1fffffff < (uint)puVar18[1])) {
        uVar23 = (uint)puVar18[1] >> 0x18 & 0x1f;
      }
      DomainTable::applyDefault(ctx,(DefaultAction *)&local_58,uVar23);
    }
    OVar9 = *opts;
    if (((ulong)OVar9 & 0xfe000000) == 0) {
LAB_0015fa54:
      bVar12 = false;
    }
    else {
      uVar23 = (this->ctx_->stats_).vars.frozen;
      if (uVar23 == 0) goto LAB_0015fa54;
      uVar3 = (this_00->assign_).trail.ebo_.size;
      if ((ulong)uVar3 != 0) {
        lVar20 = 0;
        do {
          uVar23 = uVar23 + (int)((char)((this->ctx_->varInfo_).ebo_.buf
                                         [*(uint *)((long)&((this_00->assign_).trail.ebo_.buf)->rep_
                                                   + lVar20) >> 2].rep * '\x02') >> 7);
          lVar20 = lVar20 + 4;
        } while ((ulong)uVar3 * 4 - lVar20 != 0);
      }
      bVar12 = (double)((uint)((ulong)OVar9 >> 0x19) & 0x7f) <
               ((double)uVar23 /
               (double)(~(uVar3 + (this_00->assign_).elims_) + (this_00->assign_).assign_.ebo_.size)
               ) * 100.0;
    }
    if (((((ulong)OVar9 & 3) != 0) &&
        (((this->clauses_).ebo_.size <= (OVar9._4_4_ & 0xffff) * 1000 ||
         ((ulong)OVar9 & 0xffff00000000) == 0) && !bVar12)) &&
       (iVar14 = (*this->_vptr_SatPreprocessor[3])(this,opts), (char)iVar14 != '\0')) {
      if ((this->clauses_).ebo_.size == 0) {
        local_64 = 0;
      }
      else {
        uVar17 = 0;
        local_64 = 0;
        do {
          ppCVar10 = (this->clauses_).ebo_.buf;
          pCVar11 = ppCVar10[uVar17];
          ppCVar10[uVar17] = (Clause *)0x0;
          Clause::simplify(pCVar11,this_00);
          x.rep_ = pCVar11->lits_[0].rep_;
          if ((*(byte *)((long)(this_00->assign_).assign_.ebo_.buf + (ulong)(x.rep_ & 0xfffffffc)) &
              3) == 0) {
            uVar19 = (ulong)local_64;
            local_64 = local_64 + 1;
            (this->clauses_).ebo_.buf[uVar19] = pCVar11;
          }
          else {
            operator_delete(pCVar11);
            bVar12 = SharedContext::addUnary(ctx,x);
            if (!bVar12) goto LAB_0015fbf9;
          }
          uVar23 = (int)uVar17 + 1;
          uVar17 = (ulong)uVar23;
        } while (uVar23 != (this->clauses_).ebo_.size);
      }
      (this->clauses_).ebo_.size = local_64;
      freezeSeen(this);
      bVar12 = Solver::propagate(this_00);
      if ((!bVar12) || (iVar14 = (*this->_vptr_SatPreprocessor[4])(this), (char)iVar14 == '\0'))
      goto LAB_0015fbf9;
    }
    bVar12 = Solver::simplify(this_00);
    if (bVar12) {
      pCVar1 = &this->clauses_;
      sVar15 = (this->clauses_).ebo_.size;
      if (sVar15 != 0) {
        uVar23 = 0;
        do {
          pCVar11 = (pCVar1->ebo_).buf[uVar23];
          if (pCVar11 != (Clause *)0x0) {
            local_58.lits = pCVar11->lits_;
            local_58._0_8_ = (ulong)(*(uint *)&pCVar11->field_0x8 & 0x3fffffff) << 0x20;
            RVar24 = ClauseCreator::create(this_00,&local_58,0);
            if (((undefined1  [16])RVar24 & (undefined1  [16])0x2) != (undefined1  [16])0x0)
            goto LAB_0015fbf9;
            (this->clauses_).ebo_.buf[uVar23] = (Clause *)0x0;
            operator_delete(pCVar11);
            sVar15 = (this->clauses_).ebo_.size;
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != sVar15);
      }
      ppCVar10 = (pCVar1->ebo_).buf;
      (pCVar1->ebo_).buf = (pointer)0x0;
      (this->clauses_).ebo_.size = 0;
      (this->clauses_).ebo_.cap = 0;
      bVar12 = true;
      if (ppCVar10 != (pointer)0x0) {
        operator_delete(ppCVar10);
      }
      goto LAB_0015fbfb;
    }
  }
LAB_0015fbf9:
  bVar12 = false;
LAB_0015fbfb:
  preprocess::OnExit::~OnExit(&local_48);
  return bVar12;
}

Assistant:

bool SatPreprocessor::preprocess(SharedContext& ctx, Options& opts) {
	ctx_  = &ctx;
	opts_ = &opts;
	Solver* s = ctx_->master();
	struct OnExit {
		SharedContext*   ctx;
		SatPreprocessor* self;
		SatPreprocessor* rest;
		OnExit(SatPreprocessor* s, SharedContext* c) : ctx(c), self(s), rest(0) {
			if (ctx && ctx->satPrepro.get() == s) { rest = ctx->satPrepro.release(); }
		}
		~OnExit() {
			if (self) self->cleanUp();
			if (rest) ctx->satPrepro.reset(rest);
		}
	} onExit(this, &ctx);
	for (LitVec::const_iterator it = units_.begin(), end = units_.end(); it != end; ++it) {
		if (!ctx.addUnary(*it)) return false;
	}
	units_.clear();
	// skip preprocessing if other constraints are UNSAT
	if (!s->propagate()) return false;
	if (ctx.preserveModels()) {
		opts.disableBce();
	}
	if (ctx.preserveShown()) {
		for (OutputTable::pred_iterator it = ctx.output.pred_begin(), end = ctx.output.pred_end(); it != end; ++it) {
			ctx.setFrozen(it->cond.var(), true);
		}
		for (OutputTable::range_iterator it = ctx.output.vars_begin(), end = ctx.output.vars_end(); it != end; ++it) {
			ctx.setFrozen(*it, true);
		}
	}
	if (ctx.preserveHeuristic()) {
		for (DomainTable::iterator it = ctx.heuristic.begin(), end = ctx.heuristic.end(); it != end; ++it) {
			if (!ctx.master()->isFalse(it->cond())) {
				ctx.setFrozen(it->var(), true);
			}
		}
		struct Freeze : DomainTable::DefaultAction {
			explicit Freeze(SharedContext& c) : ctx(&c) {}
			void atom(Literal p, HeuParams::DomPref, uint32) { ctx->setFrozen(p.var(), true); }
			SharedContext* ctx;
		} act(ctx);
		DomainTable::applyDefault(ctx, act, ctx.defaultDomPref());
	}

	// preprocess only if not too many vars are frozen or not too many clauses
	bool limFrozen = false;
	if (opts.limFrozen != 0 && ctx_->stats().vars.frozen) {
		uint32 varFrozen = ctx_->stats().vars.frozen;
		for (LitVec::const_iterator it = s->trail().begin(), end = s->trail().end(); it != end; ++it) {
 			varFrozen -= (ctx_->varInfo(it->var()).frozen());
 		}
		limFrozen = ((varFrozen / double(s->numFreeVars())) * 100.0) > double(opts.limFrozen);
	}
	// 1. remove SAT-clauses, strengthen clauses w.r.t false literals, attach
	if (opts.type != 0 && !opts.clauseLimit(numClauses()) && !limFrozen && initPreprocess(opts)) {
		ClauseList::size_type j = 0;
		for (ClauseList::size_type i = 0; i != clauses_.size(); ++i) {
			Clause* c   = clauses_[i]; assert(c);
			clauses_[i] = 0;
			c->simplify(*s);
			Literal x   = (*c)[0];
			if (s->value(x.var()) == value_free) {
				clauses_[j++] = c;
			}
			else {
				c->destroy();
				if (!ctx.addUnary(x)) { return false; }
			}
		}
		clauses_.erase(clauses_.begin()+j, clauses_.end());
		// 2. run preprocessing
		freezeSeen();
		if (!s->propagate() || !doPreprocess()) {
			return false;
		}
	}
	// simplify other constraints w.r.t any newly derived top-level facts
	if (!s->simplify()) return false;
	// 3. move preprocessed clauses to ctx
	for (ClauseList::size_type i = 0; i != clauses_.size(); ++i) {
		if (Clause* c = clauses_[i]) {
			if (!ClauseCreator::create(*s, ClauseRep::create(&(*c)[0], c->size()), 0)) {
				return false;
			}
			clauses_[i] = 0;
			c->destroy();
		}
	}
	ClauseList().swap(clauses_);
	return true;
}